

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeXYZ.cpp
# Opt level: O3

void __thiscall chrono::ChNodeXYZ::ArchiveOUT(ChNodeXYZ *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChNodeXYZ>(marchive);
  ChNodeBase::ArchiveOUT
            ((ChNodeBase *)
             ((long)(this->pos).m_data + *(long *)((long)this->super_ChLoadableUVW + -0x80) + -8),
             marchive);
  local_38._value = &this->pos;
  local_38._name = "pos";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->pos_dt;
  local_38._name = "pos_dt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->pos_dtdt;
  local_38._name = "pos_dtdt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChNodeXYZ::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeXYZ>();

    // serialize parent class
    ChNodeBase::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(pos);
    marchive << CHNVP(pos_dt);
    marchive << CHNVP(pos_dtdt);
}